

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O3

string * __thiscall
libtorrent::block_uploaded_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,block_uploaded_alert *this)

{
  size_t sVar1;
  char ret [200];
  string local_108;
  char local_e8 [208];
  
  peer_alert::message_abi_cxx11_(&local_108,&this->super_peer_alert);
  snprintf(local_e8,200,"%s block uploaded to a peer (piece: %d block: %d)",
           local_108._M_dataplus._M_p,(ulong)(uint)(this->piece_index).m_val,
           (ulong)*(uint *)&(this->super_peer_alert).field_0x9c);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen(local_e8);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_e8,local_e8 + sVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string block_uploaded_alert::message() const
	{
		char ret[200];
		snprintf(ret, sizeof(ret), "%s block uploaded to a peer (piece: %d block: %d)"
			, peer_alert::message().c_str(), static_cast<int>(piece_index), block_index);
		return ret;
	}